

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterTable.h
# Opt level: O2

ion_err_t __thiscall
MasterTable::addToMasterTable<int,int>
          (MasterTable *this,Dictionary<int,_int> *dictionary,ion_dictionary_size_t dictionary_size)

{
  ion_dictionary_parent_t *piVar1;
  ion_err_t iVar2;
  ion_dictionary_id_t id;
  ion_dictionary_config_info_t local_30;
  
  iVar2 = ion_master_table_get_next_id(&id);
  if (iVar2 == '\0') {
    piVar1 = (dictionary->dict).instance;
    piVar1->id = id;
    local_30.id = id;
    local_30.use_type = '\0';
    local_30.type = piVar1->key_type;
    local_30.key_size = (piVar1->record).key_size;
    local_30.value_size = (piVar1->record).value_size;
    local_30.dictionary_type = piVar1->type;
    local_30.dictionary_status = '\0';
    local_30.dictionary_size = dictionary_size;
    iVar2 = ion_master_table_write(&local_30,-2);
  }
  return iVar2;
}

Assistant:

ion_err_t
addToMasterTable(
	Dictionary<K, V>		*dictionary,
	ion_dictionary_size_t dictionary_size
) {
	ion_dictionary_id_t id;

	ion_err_t err = ion_master_table_get_next_id(&id);

	if (err_ok != err) {
		return err;
	}

	dictionary->dict.instance->id = id;

	ion_dictionary_config_info_t config = {
		.id = dictionary->dict.instance->id, .use_type = 0, .type = dictionary->dict.instance->key_type, .key_size = dictionary->dict.instance->record.key_size, .value_size = dictionary->dict.instance->record.value_size, .dictionary_size = dictionary_size, .dictionary_type = dictionary->dict.instance->type
	};

	return ion_master_table_write(&config, ION_MASTER_TABLE_WRITE_FROM_END);
}